

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O1

bool glu::sl::isValid(ValueBlock *block)

{
  VarType *this;
  VarType *pVVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  char *format;
  long lVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  ulong local_50;
  ulong local_38;
  
  bVar9 = false;
  local_50 = 0;
  do {
    lVar6 = 0x30;
    if (local_50 == 1) {
      lVar6 = 0x18;
    }
    if (local_50 == 0) {
      lVar6 = 0;
    }
    this = *(VarType **)
            ((long)&(block->inputs).
                    super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar6);
    if (this == *(VarType **)
                 ((long)&(block->inputs).
                         super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl
                         .super__Vector_impl_data._M_finish + lVar6)) {
      local_38 = 0;
    }
    else {
      lVar7 = *(long *)((long)&this[2].m_data + 8);
      pVVar1 = this[2].m_data.array.elementType;
      iVar4 = glu::VarType::getScalarSize(this);
      local_38 = (ulong)(lVar7 - (long)pVVar1 >> 2) / (ulong)(long)iVar4;
    }
    lVar7 = *(long *)((long)&(block->inputs).
                             super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar6);
    bVar10 = *(long *)((long)&(block->inputs).
                              super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
                              _M_impl.super__Vector_impl_data._M_finish + lVar6) != lVar7;
    if (bVar10) {
      lVar5 = 0;
      uVar8 = 0;
      do {
        if (*(int *)(lVar7 + lVar5) != 0) {
          format = "ERROR: Value \'%s\' is of unsupported type!\n";
LAB_0196731d:
          tcu::print(format,*(undefined8 *)(lVar7 + 0x18 + lVar5));
          if (bVar10) {
            return bVar9;
          }
          break;
        }
        lVar2 = *(long *)(lVar7 + 0x40 + lVar5);
        lVar3 = *(long *)(lVar7 + 0x38 + lVar5);
        iVar4 = glu::VarType::getScalarSize((VarType *)(lVar7 + lVar5));
        if (lVar2 - lVar3 >> 2 != (long)iVar4 * local_38) {
          format = "ERROR: Value \'%s\' has invalid number of scalars!\n";
          goto LAB_0196731d;
        }
        uVar8 = uVar8 + 1;
        lVar7 = *(long *)((long)&(block->inputs).
                                 super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar6);
        lVar5 = lVar5 + 0x50;
        bVar10 = uVar8 < (ulong)((*(long *)((long)&(block->inputs).
                                                                                                      
                                                  super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish + lVar6
                                           ) - lVar7 >> 4) * -0x3333333333333333);
      } while (bVar10);
    }
    bVar9 = 1 < local_50;
    local_50 = local_50 + 1;
    if (local_50 == 3) {
      return bVar9;
    }
  } while( true );
}

Assistant:

bool isValid (const ValueBlock& block)
{
	for (size_t storageNdx = 0; storageNdx < 3; ++storageNdx)
	{
		const vector<Value>&	values		= storageNdx == 0 ? block.inputs	:
											  storageNdx == 1 ? block.outputs	:
																block.uniforms;
		const size_t			refArrayLen	= values.empty() ? 0 : (values[0].elements.size() / (size_t)values[0].type.getScalarSize());

		for (size_t valNdx = 0; valNdx < values.size(); ++valNdx)
		{
			const Value&	value	= values[valNdx];

			if (!value.type.isBasicType())
			{
				print("ERROR: Value '%s' is of unsupported type!\n", value.name.c_str());
				return false;
			}

			if (value.elements.size() != refArrayLen*(size_t)value.type.getScalarSize())
			{
				print("ERROR: Value '%s' has invalid number of scalars!\n", value.name.c_str());
				return false;
			}
		}
	}

	return true;
}